

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O2

void draw_shape(element_t *element,render_context_t *context,render_state_t *state)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  plutovg_canvas_t *ppVar5;
  _Bool _Var6;
  string_t *psVar7;
  plutovg_fill_rule_t winding;
  stroke_dash_array_t *length;
  int i;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  plutovg_line_join_t line_join;
  float fVar11;
  float fVar12;
  plutovg_line_cap_t local_6a8;
  float miter_limit;
  length_t stroke_width;
  float stroke_opacity;
  length_t dash_offset;
  paint_t stroke;
  paint_t fill;
  stroke_dash_array_t dash_array;
  float fill_opacity;
  undefined4 uStack_234;
  
  stroke.id.data = (char *)0x0;
  stroke.id.length = 0;
  stroke.type = paint_type_none;
  stroke.color.type = color_type_fixed;
  stroke.color.value = 0;
  stroke._12_4_ = 0;
  parse_paint(element,0x1d,&stroke);
  stroke_width.value = 1.0;
  stroke_width.type = length_type_fixed;
  miter_limit = 4.0;
  if (stroke.type == paint_type_none) {
    line_join = PLUTOVG_LINE_JOIN_MITER;
    local_6a8 = PLUTOVG_LINE_CAP_BUTT;
    if (state->mode == render_mode_bounding) {
      return;
    }
  }
  else {
    line_join = PLUTOVG_LINE_JOIN_MITER;
    parse_length(element,0x24,&stroke_width,false,true);
    psVar7 = find_attribute(element,0x20,true);
    local_6a8 = PLUTOVG_LINE_CAP_BUTT;
    if (psVar7 != (string_t *)0x0) {
      dash_array.data[0] = (length_t)psVar7->data;
      pcVar9 = (char *)((long)dash_array.data[0] + psVar7->length);
      _Var6 = skip_string((char **)&dash_array,pcVar9,"butt");
      local_6a8 = PLUTOVG_LINE_CAP_BUTT;
      if (!_Var6) {
        _Var6 = skip_string((char **)&dash_array,pcVar9,"round");
        local_6a8 = PLUTOVG_LINE_CAP_ROUND;
        if (!_Var6) {
          _Var6 = skip_string((char **)&dash_array,pcVar9,"square");
          local_6a8 = (uint)_Var6 * 2;
        }
      }
      skip_ws((char **)&dash_array,pcVar9);
    }
    psVar7 = find_attribute(element,0x21,true);
    if (psVar7 != (string_t *)0x0) {
      dash_array.data[0] = (length_t)psVar7->data;
      pcVar9 = (char *)((long)dash_array.data[0] + psVar7->length);
      _Var6 = skip_string((char **)&dash_array,pcVar9,"miter");
      line_join = PLUTOVG_LINE_JOIN_MITER;
      if (!_Var6) {
        _Var6 = skip_string((char **)&dash_array,pcVar9,"round");
        line_join = PLUTOVG_LINE_JOIN_ROUND;
        if (!_Var6) {
          _Var6 = skip_string((char **)&dash_array,pcVar9,"bevel");
          line_join = (uint)_Var6 * 2;
        }
      }
      skip_ws((char **)&dash_array,pcVar9);
    }
    parse_number(element,0x22,&miter_limit,false,true);
    if (state->mode == render_mode_bounding) {
      fVar11 = resolve_length(state,&stroke_width,'o');
      fVar11 = fVar11 * 0.5;
      fVar12 = fVar11;
      if (local_6a8 == PLUTOVG_LINE_CAP_SQUARE) {
        fVar12 = fVar11 * 1.4142135;
      }
      if (line_join == PLUTOVG_LINE_JOIN_MITER) {
        fVar11 = fVar11 * miter_limit;
      }
      if (fVar12 <= fVar11) {
        fVar12 = fVar11;
      }
      uVar1 = (state->extents).x;
      uVar3 = (state->extents).y;
      uVar2 = (state->extents).w;
      uVar4 = (state->extents).h;
      (state->extents).x = (float)uVar1 - fVar12;
      (state->extents).y = (float)uVar3 - fVar12;
      (state->extents).w = fVar12 + fVar12 + (float)uVar2;
      (state->extents).h = fVar12 + fVar12 + (float)uVar4;
      return;
    }
  }
  fill.id.data = (char *)0x0;
  fill.id.length = 0;
  fill.type = paint_type_color;
  fill.color.type = color_type_fixed;
  fill.color.value = 0xff000000;
  fill._12_4_ = 0;
  parse_paint(element,9,&fill);
  _Var6 = apply_paint(state,context,&fill);
  if (_Var6) {
    _fill_opacity = (char *)CONCAT44(uStack_234,0x3f800000);
    parse_number(element,10,&fill_opacity,true,true);
    psVar7 = find_attribute(element,0xb,true);
    if (psVar7 == (string_t *)0x0) {
      winding = PLUTOVG_FILL_RULE_NON_ZERO;
    }
    else {
      dash_array.data[0] = (length_t)psVar7->data;
      pcVar9 = (char *)((long)dash_array.data[0] + psVar7->length);
      _Var6 = skip_string((char **)&dash_array,pcVar9,"nonzero");
      winding = PLUTOVG_FILL_RULE_NON_ZERO;
      if (!_Var6) {
        _Var6 = skip_string((char **)&dash_array,pcVar9,"evenodd");
        winding = (plutovg_fill_rule_t)_Var6;
      }
      skip_ws((char **)&dash_array,pcVar9);
    }
    plutovg_canvas_set_fill_rule(context->canvas,winding);
    plutovg_canvas_set_opacity(context->canvas,fill_opacity * state->opacity);
    plutovg_canvas_set_matrix(context->canvas,&state->matrix);
    plutovg_canvas_fill_path(context->canvas,context->document->path);
  }
  _Var6 = apply_paint(state,context,&stroke);
  if (_Var6) {
    stroke_opacity = 1.0;
    parse_number(element,0x23,&stroke_opacity,true,true);
    dash_offset.value = 0.0;
    dash_offset.type = length_type_fixed;
    parse_length(element,0x1f,&dash_offset,false,true);
    length = &dash_array;
    memset(length,0,0x408);
    psVar7 = find_attribute(element,0x1e,true);
    uVar10 = 0;
    if (psVar7 != (string_t *)0x0) {
      _fill_opacity = psVar7->data;
      pcVar9 = _fill_opacity + psVar7->length;
      uVar10 = 0;
      while (((_fill_opacity < pcVar9 && (uVar10 < 0x80)) &&
             (_Var6 = parse_length_value((char **)&fill_opacity,pcVar9,dash_array.data + uVar10,
                                         false), uVar10 = dash_array.size, _Var6))) {
        skip_ws_comma((char **)&fill_opacity,pcVar9);
        uVar10 = dash_array.size + 1;
        dash_array.size = uVar10;
      }
    }
    for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
      fVar12 = resolve_length(state,length->data,'o');
      (&fill_opacity)[uVar8] = fVar12;
      length = (stroke_dash_array_t *)(length->data + 1);
    }
    ppVar5 = context->canvas;
    fVar12 = resolve_length(state,&dash_offset,'o');
    plutovg_canvas_set_dash_offset(ppVar5,fVar12);
    plutovg_canvas_set_dash_array(context->canvas,&fill_opacity,(int)uVar10);
    ppVar5 = context->canvas;
    fVar12 = resolve_length(state,&stroke_width,'o');
    plutovg_canvas_set_line_width(ppVar5,fVar12);
    plutovg_canvas_set_line_cap(context->canvas,local_6a8);
    plutovg_canvas_set_line_join(context->canvas,line_join);
    plutovg_canvas_set_miter_limit(context->canvas,miter_limit);
    plutovg_canvas_set_opacity(context->canvas,stroke_opacity * state->opacity);
    plutovg_canvas_set_matrix(context->canvas,&state->matrix);
    plutovg_canvas_stroke_path(context->canvas,context->document->path);
  }
  return;
}

Assistant:

static void draw_shape(const element_t* element, const render_context_t* context, render_state_t* state)
{
    paint_t stroke = {paint_type_none};
    parse_paint(element, ATTR_STROKE, &stroke);

    length_t stroke_width = {1.f, length_type_fixed};
    plutovg_line_cap_t line_cap = PLUTOVG_LINE_CAP_BUTT;
    plutovg_line_join_t line_join = PLUTOVG_LINE_JOIN_MITER;
    float miter_limit = 4.f;

    if(stroke.type > paint_type_none) {
        parse_length(element, ATTR_STROKE_WIDTH, &stroke_width, false, true);
        parse_line_cap(element, ATTR_STROKE_LINECAP, &line_cap);
        parse_line_join(element, ATTR_STROKE_LINEJOIN, &line_join);
        parse_number(element, ATTR_STROKE_MITERLIMIT, &miter_limit, false, true);
    }

    if(state->mode == render_mode_bounding) {
        if(stroke.type == paint_type_none)
            return;
        float line_width = resolve_length(state, &stroke_width, 'o');
        float cap_limit = line_width / 2.f;
        if(line_cap == PLUTOVG_LINE_CAP_SQUARE)
            cap_limit *= PLUTOVG_SQRT2;
        float join_limit = line_width / 2.f;
        if(line_join == PLUTOVG_LINE_JOIN_MITER) {
            join_limit *= miter_limit;
        }

        float delta = MAX(cap_limit, join_limit);
        state->extents.x -= delta;
        state->extents.y -= delta;
        state->extents.w += delta * 2.f;
        state->extents.h += delta * 2.f;
        return;
    }

    paint_t fill = {paint_type_color, {color_type_fixed, 0xFF000000}};
    parse_paint(element, ATTR_FILL, &fill);

    if(apply_paint(state, context, &fill)) {
        float fill_opacity = 1.f;
        parse_number(element, ATTR_FILL_OPACITY, &fill_opacity, true, true);

        plutovg_fill_rule_t fill_rule = PLUTOVG_FILL_RULE_NON_ZERO;
        parse_fill_rule(element, ATTR_FILL_RULE, &fill_rule);

        plutovg_canvas_set_fill_rule(context->canvas, fill_rule);
        plutovg_canvas_set_opacity(context->canvas, fill_opacity * state->opacity);
        plutovg_canvas_set_matrix(context->canvas, &state->matrix);
        plutovg_canvas_fill_path(context->canvas, context->document->path);
    }

    if(apply_paint(state, context, &stroke)) {
        float stroke_opacity = 1.f;
        parse_number(element, ATTR_STROKE_OPACITY, &stroke_opacity, true, true);

        length_t dash_offset = {0.f, length_type_fixed};
        parse_length(element, ATTR_STROKE_DASHOFFSET, &dash_offset, false, true);

        stroke_dash_array_t dash_array = {0};
        parse_dash_array(element, ATTR_STROKE_DASHARRAY, &dash_array);

        float dashes[MAX_DASHES];
        for(int i = 0; i < dash_array.size; ++i) {
            dashes[i] = resolve_length(state, dash_array.data + i, 'o');
        }

        plutovg_canvas_set_dash_offset(context->canvas, resolve_length(state, &dash_offset, 'o'));
        plutovg_canvas_set_dash_array(context->canvas, dashes, dash_array.size);

        plutovg_canvas_set_line_width(context->canvas, resolve_length(state, &stroke_width, 'o'));
        plutovg_canvas_set_line_cap(context->canvas, line_cap);
        plutovg_canvas_set_line_join(context->canvas, line_join);
        plutovg_canvas_set_miter_limit(context->canvas, miter_limit);
        plutovg_canvas_set_opacity(context->canvas, stroke_opacity * state->opacity);
        plutovg_canvas_set_matrix(context->canvas, &state->matrix);
        plutovg_canvas_stroke_path(context->canvas, context->document->path);
    }
}